

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsElfFile.cpp
# Opt level: O3

bool __thiscall MipsElfFile::setSection(MipsElfFile *this,string *name)

{
  int iVar1;
  pointer ppEVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  bool bVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  
  ppEVar2 = (this->elf).segments.super__Vector_base<ElfSegment_*,_std::allocator<ElfSegment_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->elf).segments.super__Vector_base<ElfSegment_*,_std::allocator<ElfSegment_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppEVar2) {
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    do {
      iVar1 = ElfSegment::findSection(ppEVar2[(long)pbVar4],name);
      if (iVar1 != -1) {
        this->segment = (int)pbVar4;
        goto LAB_00180536;
      }
      pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&(pbVar4->_M_dataplus)._M_p + 1);
      ppEVar2 = (this->elf).segments.super__Vector_base<ElfSegment_*,_std::allocator<ElfSegment_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      in_RCX = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)(this->elf).segments.
                      super__Vector_base<ElfSegment_*,_std::allocator<ElfSegment_*>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppEVar2 >> 3);
    } while (pbVar4 < in_RCX);
  }
  iVar1 = ElfFile::findSegmentlessSection(&this->elf,name);
  if (iVar1 == -1) {
    bVar3 = false;
    Logger::queueError<std::__cxx11::string>((Logger *)0x0,0x1921d4,(char *)name,in_RCX);
  }
  else {
    this->segment = -1;
LAB_00180536:
    this->section = iVar1;
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool MipsElfFile::setSection(const std::string& name)
{
	// look in segments
	for (size_t i = 0; i < elf.getSegmentCount(); i++)
	{
		ElfSegment* seg = elf.getSegment(i);
		int n = seg->findSection(name);
		if (n != -1)
		{
			segment = (int) i;
			section = n;
			return true;
		}
	}

	// look in stray sections
	int n = elf.findSegmentlessSection(name);
	if (n != -1)
	{
		segment = -1;
		section = n;
		return true;
	}

	Logger::queueError(Logger::Warning, "Section %s not found",name);
	return false;
}